

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O1

QByteArray * __thiscall
QByteArray::toPercentEncoding
          (QByteArray *__return_storage_ptr__,QByteArray *this,QByteArray *exclude,
          QByteArray *include,char percent)

{
  byte bVar1;
  long lVar2;
  Data *pDVar3;
  size_t sVar4;
  bool bVar5;
  void *pvVar6;
  char *pcVar7;
  char *pcVar8;
  long size;
  long lVar9;
  char *pcVar10;
  
  bVar5 = isNull(this);
  if (bVar5) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    lVar2 = (this->d).size;
    if (lVar2 == 0) {
      pcVar7 = (this->d).ptr;
      if (pcVar7 == (char *)0x0) {
        pcVar7 = "";
      }
      QByteArray(__return_storage_ptr__,pcVar7,0);
    }
    else {
      (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
      pDVar3 = (this->d).d;
      (__return_storage_ptr__->d).d = pDVar3;
      (__return_storage_ptr__->d).ptr = (this->d).ptr;
      (__return_storage_ptr__->d).size = lVar2;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      lVar2 = (this->d).size;
      if (lVar2 == 0) {
        bVar5 = true;
        size = 0;
      }
      else {
        pcVar7 = (this->d).ptr;
        lVar9 = 0;
        pcVar10 = (char *)0x0;
        size = 0;
        do {
          bVar1 = pcVar7[lVar9];
          if (bVar1 == percent) {
LAB_0030aaa4:
            if (pcVar10 == (char *)0x0) {
              resize(__return_storage_ptr__,(this->d).size * 3);
              pDVar3 = (__return_storage_ptr__->d).d;
              if ((pDVar3 == (Data *)0x0) ||
                 (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
                reallocData(__return_storage_ptr__,(__return_storage_ptr__->d).size,KeepSize);
              }
              pcVar10 = (__return_storage_ptr__->d).ptr;
            }
            pcVar10[size] = percent;
            pcVar10[size + 1] = "0123456789ABCDEF"[bVar1 >> 4];
            pcVar10[size + 2] = "0123456789ABCDEF"[bVar1 & 0xf];
            size = size + 3;
          }
          else {
            if ((((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) &&
                (1 < bVar1 - 0x2d)) && ((bVar1 != 0x5f && (bVar1 != 0x7e)))) {
              sVar4 = (exclude->d).size;
              if (sVar4 != 0) {
                pcVar8 = (exclude->d).ptr;
                if (pcVar8 == (char *)0x0) {
                  pcVar8 = "";
                }
                pvVar6 = memchr(pcVar8,(int)(char)bVar1,sVar4);
                if (pvVar6 != (void *)0x0) goto LAB_0030aa6f;
              }
              goto LAB_0030aaa4;
            }
LAB_0030aa6f:
            sVar4 = (include->d).size;
            if (sVar4 != 0) {
              pcVar8 = (include->d).ptr;
              if (pcVar8 == (char *)0x0) {
                pcVar8 = "";
              }
              pvVar6 = memchr(pcVar8,(int)(char)bVar1,sVar4);
              if (pvVar6 != (void *)0x0) goto LAB_0030aaa4;
            }
            if (pcVar10 != (char *)0x0) {
              pcVar10[size] = bVar1;
            }
            size = size + 1;
          }
          lVar9 = lVar9 + 1;
        } while (lVar2 != lVar9);
        bVar5 = pcVar10 == (char *)0x0;
      }
      if ((!bVar5) && (size < (__return_storage_ptr__->d).size)) {
        resize(__return_storage_ptr__,size);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QByteArray::toPercentEncoding(const QByteArray &exclude, const QByteArray &include,
                                         char percent) const
{
    if (isNull())
        return QByteArray();    // preserve null
    if (isEmpty())
        return QByteArray(data(), 0);

    const auto contains = [](const QByteArray &view, char c) {
        // As view.contains(c), but optimised to bypass a lot of overhead:
        return view.size() > 0 && memchr(view.data(), c, view.size()) != nullptr;
    };

    QByteArray result = *this;
    char *output = nullptr;
    qsizetype length = 0;

    for (unsigned char c : *this) {
        if (char(c) != percent
            && ((c >= 0x61 && c <= 0x7A) // ALPHA
                || (c >= 0x41 && c <= 0x5A) // ALPHA
                || (c >= 0x30 && c <= 0x39) // DIGIT
                || c == 0x2D // -
                || c == 0x2E // .
                || c == 0x5F // _
                || c == 0x7E // ~
                || contains(exclude, c))
            && !contains(include, c)) {
            if (output)
                output[length] = c;
            ++length;
        } else {
            if (!output) {
                // detach now
                result.resize(size() * 3); // worst case
                output = result.data();
            }
            output[length++] = percent;
            output[length++] = QtMiscUtils::toHexUpper((c & 0xf0) >> 4);
            output[length++] = QtMiscUtils::toHexUpper(c & 0xf);
        }
    }
    if (output)
        result.truncate(length);

    return result;
}